

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O0

void qDrawWinPanel(QPainter *p,int x,int y,int w,int h,QPalette *pal,bool sunken,QBrush *fill)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  byte in_stack_00000008;
  QColor *in_stack_00000010;
  QColor *in_stack_00000040;
  QColor *in_stack_00000048;
  QColor *in_stack_00000050;
  QBrush *in_stack_00000058;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  
  if ((in_stack_00000008 & 1) == 0) {
    QPalette::light((QPalette *)0x3f9eb1);
    QBrush::color((QBrush *)0x3f9eb9);
    QPalette::shadow((QPalette *)0x3f9ecb);
    QBrush::color((QBrush *)0x3f9ed3);
    QPalette::midlight((QPalette *)0x3f9ee3);
    QBrush::color((QBrush *)0x3f9eeb);
    QPalette::dark((QPalette *)0x3f9efd);
    QBrush::color((QBrush *)0x3f9f05);
    qDrawWinShades((QPainter *)CONCAT44(in_EDX,in_ESI),(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_00000010,
                   in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058);
  }
  else {
    QPalette::dark((QPalette *)0x3f9dcf);
    QBrush::color((QBrush *)0x3f9dd7);
    QPalette::light((QPalette *)0x3f9de9);
    QBrush::color((QBrush *)0x3f9df1);
    QPalette::shadow((QPalette *)0x3f9e01);
    QBrush::color((QBrush *)0x3f9e09);
    QPalette::midlight((QPalette *)0x3f9e1b);
    QBrush::color((QBrush *)0x3f9e23);
    qDrawWinShades((QPainter *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_00000010,
                   in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058);
  }
  return;
}

Assistant:

void qDrawWinPanel(QPainter *p, int x, int y, int w, int h,
                    const QPalette &pal, bool        sunken,
                    const QBrush *fill)
{
    if (sunken)
        qDrawWinShades(p, x, y, w, h,
                        pal.dark().color(), pal.light().color(), pal.shadow().color(),
                       pal.midlight().color(), fill);
    else
        qDrawWinShades(p, x, y, w, h,
                       pal.light().color(), pal.shadow().color(), pal.midlight().color(),
                       pal.dark().color(), fill);
}